

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_function_impl.h
# Opt level: O1

void __thiscall
dlib::any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL>::
derived<dlib::member_function_pointer<const_dlib::vector<long,_2L>_&,_bool,_unsigned_long,_void>,_void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long)>
::copy_to(derived<dlib::member_function_pointer<const_dlib::vector<long,_2L>_&,_bool,_unsigned_long,_void>,_void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long)>
          *this,unique_ptr<dlib::any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL>::Tbase<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long)>,_std::default_delete<dlib::any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL>::Tbase<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long)>_>_>
                *dest)

{
  Tbase<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long)> *pTVar1;
  Tbase<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long)> *pTVar2;
  
  pTVar2 = (Tbase<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long)> *)operator_new(0x50);
  pTVar2->_vptr_Tbase = (_func_int **)&PTR__derived_00322d98;
  pTVar2[8]._vptr_Tbase = (_func_int **)(pTVar2 + 2);
  (**(code **)(*(this->item).super_mfp_kernel_1_base_class<3UL>.mp_memory.data + 0x10))();
  pTVar1 = (dest->_M_t).
           super___uniq_ptr_impl<dlib::any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL>::Tbase<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long)>,_std::default_delete<dlib::any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL>::Tbase<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long)>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_dlib::any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL>::Tbase<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long)>_*,_std::default_delete<dlib::any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL>::Tbase<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long)>_>_>
           .
           super__Head_base<0UL,_dlib::any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL>::Tbase<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long)>_*,_false>
           ._M_head_impl;
  (dest->_M_t).
  super___uniq_ptr_impl<dlib::any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL>::Tbase<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long)>,_std::default_delete<dlib::any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL>::Tbase<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long)>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_dlib::any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL>::Tbase<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long)>_*,_std::default_delete<dlib::any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL>::Tbase<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long)>_>_>
  .
  super__Head_base<0UL,_dlib::any_function<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long),_void,_3UL>::Tbase<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long)>_*,_false>
  ._M_head_impl = pTVar2;
  if (pTVar1 != (Tbase<void_(const_dlib::vector<long,_2L>_&,_bool,_unsigned_long)> *)0x0) {
    (*pTVar1->_vptr_Tbase[1])();
    return;
  }
  return;
}

Assistant:

DLIB_ANY_FUNCTION_DERIVED_BOILERPLATE

    virtual result_type evaluate (
        A1 a1, A2 a2, A3 a3
    ) const { DLIB_ANY_FUNCTION_RETURN item(a1,a2,a3); }